

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O1

void anon_unknown.dwarf_38109::generateRandomScanFile
               (string *filename,int channelCount,Compression compression)

{
  PixelType PVar1;
  int iVar2;
  PixelType PVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  char cVar7;
  int *piVar8;
  Array2D<void_*> *pAVar9;
  result_type rVar10;
  uint uVar11;
  ostream *this;
  long *plVar12;
  string *psVar13;
  ulong uVar14;
  void *pvVar15;
  void *pvVar16;
  long lVar17;
  long lVar18;
  int i_1;
  uint uVar19;
  int j;
  int iVar20;
  long lVar21;
  ushort uVar22;
  ushort uVar23;
  ulong uVar24;
  int i;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  float fVar28;
  Array<Imf_3_2::Array2D<void_*>_> data;
  ushort local_2a0;
  int type;
  undefined4 uStack_294;
  long local_288 [2];
  default_random_engine generator;
  DeepScanLineOutputFile file;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  ostream local_1e0 [112];
  ios_base local_170 [264];
  Channel local_68 [56];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  generating deep scanline file \'",0x21);
  this = std::__ostream_insert<char,std::char_traits<char>>
                   ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\' compression ",0xe);
  plVar12 = (long *)std::ostream::operator<<(this,compression);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header
            ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_2::Header::~Header((Header *)&ss);
  generator._M_x = 1;
  if (DAT_0019a968._M_current != (anonymous_namespace)::channelTypes) {
    DAT_0019a968._M_current = (anonymous_namespace)::channelTypes;
  }
  if (0 < channelCount) {
    iVar20 = 0;
    do {
      _ss = 0x200000000;
      type = std::uniform_int_distribution<int>::operator()
                       ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,iVar20);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        psVar13 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,UINT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar13,(Channel *)&frameBuffer);
      }
      if (type == 1) {
        psVar13 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,HALF,1,1,false);
        Imf_3_2::ChannelList::insert(psVar13,(Channel *)&frameBuffer);
      }
      if (type == 2) {
        psVar13 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,FLOAT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar13,(Channel *)&frameBuffer);
      }
      if (DAT_0019a968._M_current == DAT_0019a970) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_0019a968,&type);
      }
      else {
        *DAT_0019a968._M_current = type;
        DAT_0019a968._M_current = DAT_0019a968._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      iVar20 = iVar20 + 1;
    } while (channelCount != iVar20);
  }
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(long)channelCount);
  uVar14 = (ulong)(uint)channelCount;
  if (0 < channelCount) {
    lVar26 = 0;
    do {
      pAVar9 = data._data;
      pvVar15 = operator_new__(0x5a1c8);
      pvVar16 = *(void **)((long)&pAVar9->_data + lVar26);
      if (pvVar16 != (void *)0x0) {
        operator_delete__(pvVar16);
      }
      *(undefined8 *)((long)&pAVar9->_sizeX + lVar26) = 0xa9;
      *(undefined8 *)((long)&pAVar9->_sizeY + lVar26) = 0x111;
      *(void **)((long)&pAVar9->_data + lVar26) = pvVar15;
      lVar26 = lVar26 + 0x18;
    } while (uVar14 * 0x18 != lVar26);
  }
  pvVar16 = operator_new__(0x2d0e4);
  if ((anonymous_namespace)::sampleCountScans._16_8_ != 0) {
    operator_delete__((void *)(anonymous_namespace)::sampleCountScans._16_8_);
  }
  (anonymous_namespace)::sampleCountScans._0_8_ = 0xa9;
  (anonymous_namespace)::sampleCountScans._8_8_ = 0x111;
  (anonymous_namespace)::sampleCountScans._16_8_ = pvVar16;
  remove((filename->_M_dataplus)._M_p);
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((anonymous_namespace)::sampleCountScans._16_8_ +
                      (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_0019a944 * -0x444),4,
             0x444,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  if (0 < channelCount) {
    lVar26 = 0x10;
    uVar27 = 0;
    do {
      PVar1 = (anonymous_namespace)::channelTypes[uVar27];
      PVar3 = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        PVar3 = PVar1;
      }
      if (PVar1 == FLOAT) {
        PVar3 = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,(int)uVar27);
      std::__cxx11::stringbuf::str();
      iVar20 = (anonymous_namespace)::channelTypes[uVar27];
      uVar24 = (ulong)(iVar20 == 0) << 2;
      if (iVar20 == 1) {
        uVar24 = 2;
      }
      if (iVar20 == 2) {
        uVar24 = 4;
      }
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)local_68,PVar3,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar26) +
                          (long)(anonymous_namespace)::dataWindow * -8 + (long)DAT_0019a944 * -0x888
                         ),8,0x888,uVar24,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      if ((long *)CONCAT44(uStack_294,type) != local_288) {
        operator_delete((long *)CONCAT44(uStack_294,type),local_288[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      uVar27 = uVar27 + 1;
      lVar26 = lVar26 + 0x18;
    } while (uVar14 != uVar27);
  }
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  lVar26 = 0;
  do {
    iVar20 = (int)lVar26 * 0x111;
    lVar21 = 0;
    do {
      _ss = 0x900000000;
      rVar10 = std::uniform_int_distribution<int>::operator()
                         ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
      lVar18 = (anonymous_namespace)::sampleCountScans._8_8_ * lVar26 * 4;
      *(result_type *)((anonymous_namespace)::sampleCountScans._16_8_ + lVar18 + lVar21 * 4) =
           rVar10 + 1;
      if (0 < channelCount) {
        iVar4 = (int)lVar21;
        uVar19 = iVar20 + iVar4;
        fVar28 = (float)((uint)(iVar20 + iVar4) % 0x801);
        uVar11 = (uint)fVar28 & 0x7fffff | 0x800000;
        cVar7 = (char)((uint)fVar28 >> 0x17);
        uVar25 = (uint)fVar28 >> 0xd & 0x3ff;
        local_2a0 = (ushort)(0x80000000 < uVar11 << (cVar7 + 0xa2U & 0x1f)) +
                    (short)(uVar11 >> (0x7eU - cVar7 & 0x1f));
        uVar5 = (ushort)((int)fVar28 + 0x8000fff + (uint)(((uint)fVar28 >> 0xd & 1) != 0) >> 0xd);
        if (0x477fefff < (uint)fVar28) {
          uVar5 = 0x7c00;
        }
        uVar6 = (ushort)uVar25 | 0x7c00 | (ushort)(uVar25 == 0);
        if (fVar28 == INFINITY) {
          uVar6 = 0x7c00;
        }
        uVar27 = 0;
        do {
          if ((anonymous_namespace)::channelTypes[uVar27] == 0) {
            pvVar16 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCountScans._16_8_
                                                      + lVar18 + lVar21 * 4) << 2);
            data._data[uVar27]._data[data._data[uVar27]._sizeY * lVar26 + lVar21] = pvVar16;
          }
          if ((anonymous_namespace)::channelTypes[uVar27] == 1) {
            pvVar16 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCountScans._16_8_
                                                      + lVar18 + lVar21 * 4) * 2);
            data._data[uVar27]._data[data._data[uVar27]._sizeY * lVar26 + lVar21] = pvVar16;
          }
          if ((anonymous_namespace)::channelTypes[uVar27] == 2) {
            pvVar16 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCountScans._16_8_
                                                      + lVar18 + lVar21 * 4) << 2);
            data._data[uVar27]._data[data._data[uVar27]._sizeY * lVar26 + lVar21] = pvVar16;
          }
          piVar8 = (anonymous_namespace)::channelTypes;
          lVar17 = (anonymous_namespace)::sampleCountScans._16_8_ + lVar18;
          if (*(int *)(lVar17 + lVar21 * 4) != 0) {
            uVar24 = 0;
            do {
              if (piVar8[uVar27] == 0) {
                *(uint *)((long)data._data[uVar27]._data
                                [data._data[uVar27]._sizeY * lVar26 + lVar21] + uVar24 * 4) =
                     uVar19 - ((uVar19 / 0x801) * 0x800 + uVar19 / 0x801);
              }
              iVar2 = piVar8[uVar27];
              if (iVar2 == 2) {
                *(float *)((long)data._data[uVar27]._data
                                 [data._data[uVar27]._sizeY * lVar26 + lVar21] + uVar24 * 4) =
                     (float)((uint)(iVar20 + iVar4) % 0x801);
              }
              else if (iVar2 == 1) {
                uVar22 = uVar5;
                if (0x7f7fffff < (uint)fVar28) {
                  uVar22 = uVar6;
                }
                uVar23 = local_2a0;
                if ((uint)fVar28 < 0x33000001) {
                  uVar23 = 0;
                }
                if (0x387fffff < (uint)fVar28) {
                  uVar23 = uVar22;
                }
                *(ushort *)
                 ((long)data._data[uVar27]._data[data._data[uVar27]._sizeY * lVar26 + lVar21] +
                 uVar24 * 2) = uVar23;
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 < *(uint *)(lVar17 + lVar21 * 4));
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar14);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x111);
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0xa9);
  Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
  lVar26 = 0;
  do {
    lVar21 = 0;
    do {
      if (0 < channelCount) {
        lVar18 = 4;
        uVar27 = 0;
        do {
          if (((anonymous_namespace)::channelTypes[uVar27] == 0) &&
             (pvVar16 = *(void **)(*(long *)((long)data._data + lVar18 * 4 + -8) * lVar26 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar18 * 4) + lVar21 * 8)
             , pvVar16 != (void *)0x0)) {
            operator_delete__(pvVar16);
          }
          if (((anonymous_namespace)::channelTypes[uVar27] == 1) &&
             (pvVar16 = *(void **)(*(long *)((long)data._data + lVar18 * 4 + -8) * lVar26 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar18 * 4) + lVar21 * 8)
             , pvVar16 != (void *)0x0)) {
            operator_delete__(pvVar16);
          }
          if (((anonymous_namespace)::channelTypes[uVar27] == 2) &&
             (pvVar16 = *(void **)(*(long *)((long)data._data + lVar18 * 4 + -8) * lVar26 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar18 * 4) + lVar21 * 8)
             , pvVar16 != (void *)0x0)) {
            operator_delete__(pvVar16);
          }
          uVar27 = uVar27 + 1;
          lVar18 = lVar18 + 6;
        } while (uVar14 != uVar27);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x111);
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0xa9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  --> done",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
  return;
}

Assistant:

void
generateRandomScanFile (
    const std::string& filename, int channelCount, Compression compression)
{
    std::cout << "  generating deep scanline file '" << filename
              << "' compression " << compression << std::endl;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    std::default_random_engine generator;
    auto                       generate_random_int = [&] (int range) -> int {
        std::uniform_int_distribution<int> distribution (0, range - 1);
        return distribution (generator);
    };
    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int               type = generate_random_int (3);
        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPSCANLINE);

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    sampleCountScans.resizeErase (height, width);

    remove (filename.c_str ());
    DeepScanLineOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&sampleCountScans[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str, // name // 6
            DeepSlice (
                type, // type // 7
                (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8
                pointerSize * 1,     // xStride// 9
                pointerSize * width, // yStride// 10
                sampleSize));        // sampleStride
    }

    file.setFrameBuffer (frameBuffer);

    for (int i = 0; i < height; i++)
    {
        //
        // Fill in data at the last minute.
        //

        for (int j = 0; j < width; j++)
        {
            sampleCountScans[i][j] = generate_random_int (10) + 1;
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0)
                    data[k][i][j] = new unsigned int[sampleCountScans[i][j]];
                if (channelTypes[k] == 1)
                    data[k][i][j] = new half[sampleCountScans[i][j]];
                if (channelTypes[k] == 2)
                    data[k][i][j] = new float[sampleCountScans[i][j]];
                for (unsigned int l = 0; l < sampleCountScans[i][j]; l++)
                {
                    if (channelTypes[k] == 0)
                        ((unsigned int*) data[k][i][j])[l] =
                            (i * width + j) % 2049;
                    if (channelTypes[k] == 1)
                        ((half*) data[k][i][j])[l] = (i * width + j) % 2049;
                    if (channelTypes[k] == 2)
                        ((float*) data[k][i][j])[l] = (i * width + j) % 2049;
                }
            }
        }
    }

    file.writePixels (height);

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0) delete[](unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
            }

    std::cout << "  --> done" << std::endl;
}